

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O3

bool __thiscall
ICM::Function::Signature::checkType
          (Signature *this,vector<ICM::TypeObject,_std::allocator<ICM::TypeObject>_> *argT)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  RIterator<unsigned_long> __end2;
  ulong uVar6;
  bool bVar7;
  
  bVar2 = this->last_is_args;
  uVar6 = (*(long *)(argT + 8) - *(long *)argT >> 3) * -0x5555555555555555;
  uVar3 = (this->InType)._capacity;
  if ((bool)bVar2 == true) {
    if (uVar3 <= uVar6) {
      uVar6 = uVar3 - 1;
LAB_00139099:
      if (uVar6 != 0) {
        lVar5 = 0;
        uVar3 = uVar6;
        do {
          bVar1 = TypeObject::checkType
                            ((TypeObject *)
                             ((long)&((this->InType)._data.
                                      super___shared_ptr<ICM::TypeObject,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->type + lVar5),(TypeObject *)(*(long *)argT + lVar5));
          if (!bVar1) {
            return false;
          }
          lVar5 = lVar5 + 0x18;
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
        bVar2 = this->last_is_args;
      }
      if ((bVar2 & 1) != 0) {
        uVar3 = (*(long *)(argT + 8) - *(long *)argT >> 3) * -0x5555555555555555;
        if (uVar6 == uVar3) {
          return true;
        }
        lVar4 = ~uVar6 + uVar3;
        lVar5 = uVar6 * 0x18;
        do {
          bVar1 = TypeObject::checkType
                            ((this->InType)._data.
                             super___shared_ptr<ICM::TypeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                             + ((this->InType)._capacity - 1),(TypeObject *)(*(long *)argT + lVar5))
          ;
          bVar7 = lVar4 == 0;
          lVar4 = lVar4 + -1;
          if (bVar7) {
            return bVar1;
          }
          lVar5 = lVar5 + 0x18;
        } while (bVar1);
        return bVar1;
      }
      return true;
    }
  }
  else if (uVar6 - uVar3 == 0) goto LAB_00139099;
  return false;
}

Assistant:

bool Signature::checkType(const vector<TypeObject> &argT) const {
			// Check Size
			if (last_is_args) {
				if (argT.size() < InType.size())
					return false;
			}
			else if (argT.size() != InType.size()) {
				return false;
			}
			// Check Type
			size_t size = last_is_args ? InType.size() - 1 : InType.size();
			for (auto i : Range<size_t>(0, size))
				if (!InType[i].checkType(argT[i]))
					return false;
			if (last_is_args) {
				for (auto i : Range<size_t>(size, argT.size()))
					if (!InType.back().checkType(argT[i]))
						return false;
			}
			return true;
		}